

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void nmult(double *A,double *B,double *C,int ra,int ca,int cb)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  
  if (0 < ra) {
    uVar1 = (ulong)(uint)cb;
    uVar5 = 0;
    uVar8 = 0;
    do {
      if (0 < cb) {
        lVar2 = uVar8 * uVar1;
        uVar3 = 0;
        pdVar6 = B;
        do {
          C[lVar2 + uVar3] = 0.0;
          if (0 < ca) {
            dVar9 = C[lVar2 + uVar3];
            uVar4 = 0;
            pdVar7 = pdVar6;
            do {
              dVar9 = dVar9 + A[uVar5 + uVar4] * *pdVar7;
              C[lVar2 + uVar3] = dVar9;
              uVar4 = uVar4 + 1;
              pdVar7 = pdVar7 + uVar1;
            } while ((uint)ca != uVar4);
          }
          uVar3 = uVar3 + 1;
          pdVar6 = pdVar6 + 1;
        } while (uVar3 != uVar1);
      }
      uVar8 = uVar8 + 1;
      uVar5 = (ulong)(uint)((int)uVar5 + ca);
    } while (uVar8 != (uint)ra);
  }
  return;
}

Assistant:

void nmult(double* A, double* B, double* C,int ra,int ca, int cb) {
	register int i,j,k;
	int u,v,t,rb;
	
	/*
	 * C = A * B , where A is a ra*ca matric while B is a rb*cb
	 * with ca = rb
	 * Matrix C is a ra*cb matrix
	 */ 
	 
	rb = ca;
	#pragma omp parallel for private(i,j,k,v,u,t)
	for (i = 0; i < ra; ++i) {
		for (j = 0; j < cb; ++j) {
			v = i * rb;
			u = i *cb;
			t = j + u;
			C[t] = 0.;
			for (k = 0; k < rb;++k) {
				C[t] += A[k + v] * B[j + k * cb];
			}
		}
	}


}